

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O0

Gia_Man_t * Gia_ManFromAigSimple(Aig_Man_t *p)

{
  int iVar1;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar2;
  Aig_Obj_t *pObj_00;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Gia_Man_t *pNew;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  p_00->nConstrs = p->nConstrs;
  Aig_ManCleanData(p);
  local_24 = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_24) {
      iVar1 = Aig_ManRegNum(p);
      Gia_ManSetRegNum(p_00,iVar1);
      return p_00;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if (pObj_00 != (Aig_Obj_t *)0x0) {
      iVar1 = Aig_ObjIsAnd(pObj_00);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsCi(pObj_00);
        if (iVar1 == 0) {
          iVar1 = Aig_ObjIsCo(pObj_00);
          if (iVar1 == 0) {
            iVar1 = Aig_ObjIsConst1(pObj_00);
            if (iVar1 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaAig.c"
                            ,0xc3,"Gia_Man_t *Gia_ManFromAigSimple(Aig_Man_t *)");
            }
            (pObj_00->field_5).iData = 1;
          }
          else {
            iVar1 = Gia_ObjChild0Copy(pObj_00);
            iVar1 = Gia_ManAppendCo(p_00,iVar1);
            (pObj_00->field_5).iData = iVar1;
          }
        }
        else {
          iVar1 = Gia_ManAppendCi(p_00);
          (pObj_00->field_5).iData = iVar1;
        }
      }
      else {
        iVar1 = Gia_ObjChild0Copy(pObj_00);
        iLit1 = Gia_ObjChild1Copy(pObj_00);
        iVar1 = Gia_ManAppendAnd(p_00,iVar1,iLit1);
        (pObj_00->field_5).iData = iVar1;
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManFromAigSimple( Aig_Man_t * p )
{
    Gia_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // create the new manager
    pNew = Gia_ManStart( Aig_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjIsAnd(pObj) )
            pObj->iData = Gia_ManAppendAnd( pNew, Gia_ObjChild0Copy(pObj), Gia_ObjChild1Copy(pObj) );
        else if ( Aig_ObjIsCi(pObj) )
            pObj->iData = Gia_ManAppendCi( pNew );
        else if ( Aig_ObjIsCo(pObj) )
            pObj->iData = Gia_ManAppendCo( pNew, Gia_ObjChild0Copy(pObj) );
        else if ( Aig_ObjIsConst1(pObj) )
            pObj->iData = 1;
        else
            assert( 0 );
    }
    Gia_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    return pNew;
}